

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
::reserve(vector<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
          *this,size_t n)

{
  optional<std::pair<pbrt::Light,_unsigned_int>_> *poVar1;
  ulong in_RSI;
  vector<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
  *in_RDI;
  int i;
  optional<std::pair<pbrt::Light,_unsigned_int>_> *ra;
  optional<std::pair<pbrt::Light,_unsigned_int>_> *in_stack_ffffffffffffffc8;
  optional<std::pair<pbrt::Light,_unsigned_int>_> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    poVar1 = pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,unsigned_int>>>::
             allocate_object<pstd::optional<std::pair<pbrt::Light,unsigned_int>>>
                       ((polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>
                         *)in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = poVar1 + local_1c;
      begin(in_RDI);
      pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,unsigned_int>>>::
      construct<pstd::optional<std::pair<pbrt::Light,unsigned_int>>,pstd::optional<std::pair<pbrt::Light,unsigned_int>>>
                ((polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_> *)
                 in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                 (optional<std::pair<pbrt::Light,_unsigned_int>_> *)0x8ea242);
      begin(in_RDI);
      pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,unsigned_int>>>::
      destroy<pstd::optional<std::pair<pbrt::Light,unsigned_int>>>
                ((polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_> *)
                 in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,unsigned_int>>>::
    deallocate_object<pstd::optional<std::pair<pbrt::Light,unsigned_int>>>
              ((polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_> *)
               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x8ea284);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = poVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }